

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_create(char *zipname,char **filenames,size_t len)

{
  char cVar1;
  char *__file;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  mz_bool mVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  char *pArchive_name;
  char *pcVar10;
  int iVar11;
  mz_zip_archive zip_archive;
  stat file_stat;
  mz_zip_archive local_138;
  stat local_c0;
  
  iVar11 = -0x16;
  if ((zipname != (char *)0x0) && (*zipname != '\0')) {
    local_138.m_pIO_opaque = (void *)0x0;
    local_138.m_pState = (mz_zip_internal_state *)0x0;
    local_138.m_pWrite = (mz_file_write_func)0x0;
    local_138.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
    local_138.m_pAlloc_opaque = (void *)0x0;
    local_138.m_pRead = (mz_file_read_func)0x0;
    local_138.m_pFree = (mz_free_func)0x0;
    local_138.m_pRealloc = (mz_realloc_func)0x0;
    local_138.m_file_offset_alignment = 0;
    local_138.m_pAlloc = (mz_alloc_func)0x0;
    local_138.m_total_files = 0;
    local_138.m_zip_mode = MZ_ZIP_MODE_INVALID;
    local_138.m_zip_type = MZ_ZIP_TYPE_INVALID;
    local_138.m_last_error = MZ_ZIP_NO_ERROR;
    local_138.m_archive_size = 0;
    local_138.m_central_directory_file_ofs = 0;
    iVar11 = 0;
    mVar5 = mz_zip_writer_init_file_v2(&local_138,zipname,0,0);
    if (mVar5 == 0) {
      iVar11 = -1;
    }
    else {
      memset(&local_c0,0,0x90);
      if (len != 0) {
        sVar9 = 0;
        do {
          __file = filenames[sVar9];
          if (__file == (char *)0x0) {
            iVar11 = -2;
            goto LAB_00110840;
          }
          iVar6 = stat(__file,&local_c0);
          iVar11 = -0x13;
          if (iVar6 != 0) goto LAB_00110840;
          uVar8 = local_c0.st_mode & 0xf000;
          uVar7 = local_c0.st_mode & 0xfff;
          if (uVar8 == 0x4000) {
            uVar7 = local_c0.st_mode;
          }
          uVar2 = uVar7 | 0xffff8000;
          if (uVar8 != 0x8000) {
            uVar2 = uVar7;
          }
          uVar7 = uVar2 | 0xffffa000;
          if (uVar8 != 0xa000) {
            uVar7 = uVar2;
          }
          uVar2 = uVar7 | 0x6000;
          if (uVar8 != 0x6000) {
            uVar2 = uVar7;
          }
          uVar7 = uVar2 | 0x2000;
          if (uVar8 != 0x2000) {
            uVar7 = uVar2;
          }
          uVar2 = uVar7 | 0x1000;
          if (uVar8 != 0x1000) {
            uVar2 = uVar7;
          }
          uVar7 = uVar2 | 0xffffc000;
          if (uVar8 != 0xc000) {
            uVar7 = uVar2;
          }
          uVar7 = (local_c0.st_mode >> 7 & 1 | uVar7 << 0x10) ^ 1;
          bVar4 = true;
          pcVar10 = __file;
          pcVar3 = __file;
          while( true ) {
            do {
              do {
                pArchive_name = pcVar10;
                pcVar10 = pcVar3 + 1;
                cVar1 = *pcVar3;
                pcVar3 = pcVar10;
              } while (cVar1 == '/');
            } while (cVar1 == '\\');
            if (cVar1 == '\0') break;
            bVar4 = false;
            pcVar10 = pArchive_name;
          }
          if (uVar8 == 0x4000) {
            uVar7 = uVar7 + 0x10;
          }
          if (*pArchive_name == '\0') {
            if (*__file == '/') {
              if (bVar4) {
LAB_001107e7:
                pArchive_name = pArchive_name + -1;
              }
            }
            else if ((bool)(*__file == '\\' & bVar4)) goto LAB_001107e7;
          }
          mVar5 = mz_zip_writer_add_file(&local_138,pArchive_name,__file,"",0,6,uVar7);
          if (mVar5 == 0) goto LAB_00110840;
          sVar9 = sVar9 + 1;
        } while (sVar9 != len);
        iVar11 = 0;
      }
LAB_00110840:
      mz_zip_writer_finalize_archive(&local_138);
      mz_zip_writer_end_internal(&local_138,1);
    }
  }
  return iVar11;
}

Assistant:

int zip_create(const char *zipname, const char *filenames[], size_t len) {
  int err = 0;
  size_t i;
  mz_zip_archive zip_archive;
  struct MZ_FILE_STAT_STRUCT file_stat;
  mz_uint32 ext_attributes = 0;
  mz_uint16 modes;

  if (!zipname || strlen(zipname) < 1) {
    // zip_t archive name is empty or NULL
    return ZIP_EINVZIPNAME;
  }

  // Create a new archive.
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return ZIP_EMEMSET;
  }

  if (!mz_zip_writer_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive writer
    return ZIP_ENOINIT;
  }

  if (!memset((void *)&file_stat, 0, sizeof(struct MZ_FILE_STAT_STRUCT))) {
    return ZIP_EMEMSET;
  }

  for (i = 0; i < len; ++i) {
    const char *name = filenames[i];
    if (!name) {
      err = ZIP_EINVENTNAME;
      break;
    }

    if (MZ_FILE_STAT(name, &file_stat) != 0) {
      // problem getting information - check errno
      err = ZIP_ENOFILE;
      break;
    }

#if defined(_WIN32) || defined(__WIN32__) || defined(DJGPP)
    (void)modes; // unused
#else

    /* Initialize with permission bits--which are not implementation-optional */
    modes = file_stat.st_mode &
            (S_IRWXU | S_IRWXG | S_IRWXO | S_ISUID | S_ISGID | S_ISVTX);
    if (S_ISDIR(file_stat.st_mode))
      modes |= UNX_IFDIR;
    if (S_ISREG(file_stat.st_mode))
      modes |= UNX_IFREG;
    if (S_ISLNK(file_stat.st_mode))
      modes |= UNX_IFLNK;
    if (S_ISBLK(file_stat.st_mode))
      modes |= UNX_IFBLK;
    if (S_ISCHR(file_stat.st_mode))
      modes |= UNX_IFCHR;
    if (S_ISFIFO(file_stat.st_mode))
      modes |= UNX_IFIFO;
    if (S_ISSOCK(file_stat.st_mode))
      modes |= UNX_IFSOCK;
    ext_attributes = (modes << 16) | !(file_stat.st_mode & S_IWUSR);
    if ((file_stat.st_mode & S_IFMT) == S_IFDIR) {
      ext_attributes |= MZ_ZIP_DOS_DIR_ATTRIBUTE_BITFLAG;
    }
#endif

    if (!mz_zip_writer_add_file(&zip_archive, zip_basename(name), name, "", 0,
                                ZIP_DEFAULT_COMPRESSION_LEVEL,
                                ext_attributes)) {
      // Cannot add file to zip_archive
      err = ZIP_ENOFILE;
      break;
    }
  }

  mz_zip_writer_finalize_archive(&zip_archive);
  mz_zip_writer_end(&zip_archive);
  return err;
}